

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  pointer pMVar2;
  ostream *os;
  long in_FS_OFFSET;
  Colour colourGuard;
  Colour colourGuard_1;
  char local_79;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar2 = (this->itMessage)._M_current;
  if (pMVar2 != pMVar1) {
    Colour::use(colour);
    os = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(os," with ",6);
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"message","");
    local_58 = (undefined1  [8])(((long)pMVar1 - (long)pMVar2 >> 3) * -0x71c71c71c71c71c7);
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,local_78 + local_70);
    operator<<(os,(pluralise *)local_58);
    local_79 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_79,1);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    Colour::use(None);
    pMVar2 = (this->itMessage)._M_current;
    while (pMVar2 != pMVar1) {
      if ((this->printInfoMessages == false) && (pMVar2->type == Info)) {
        (this->itMessage)._M_current = pMVar2 + 1;
      }
      else {
        printMessage(this);
        if ((this->itMessage)._M_current != pMVar1) {
          local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
          Colour::use(FileName);
          std::__ostream_insert<char,std::char_traits<char>>(this->stream," and",4);
          Colour::use(None);
        }
      }
      pMVar2 = (this->itMessage)._M_current;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printRemainingMessages(Colour::Code colour = dimColour()) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(std::distance(itMessage, itEnd));

        {
            Colour colourGuard(colour);
            stream << " with " << pluralise(N, "message") << ':';
        }

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    Colour colourGuard(dimColour());
                    stream << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }